

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nw_striped_sse41_128_32.c
# Opt level: O2

parasail_result_t *
parasail_nw_table_striped_profile_sse41_128_32
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  uint *puVar1;
  int *piVar2;
  int iVar3;
  void *pvVar4;
  parasail_matrix_t *ppVar5;
  uint uVar6;
  int iVar7;
  undefined4 extraout_EAX;
  parasail_result_t *ppVar8;
  __m128i *palVar9;
  __m128i *ptr;
  int32_t *ptr_00;
  uint uVar10;
  char *pcVar11;
  int iVar12;
  ulong uVar13;
  int iVar14;
  ulong size;
  __m128i *ptr_01;
  char *__format;
  int iVar15;
  long lVar16;
  __m128i *palVar17;
  long lVar18;
  int iVar19;
  uint uVar20;
  ulong uVar21;
  uint uVar22;
  uint uVar25;
  uint uVar26;
  uint uVar27;
  undefined1 auVar23 [16];
  __m128i alVar24;
  uint uVar28;
  uint uVar30;
  uint uVar31;
  uint uVar32;
  undefined1 auVar29 [16];
  uint uVar33;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  undefined1 auVar34 [16];
  uint uVar38;
  uint uVar39;
  uint uVar40;
  uint uVar41;
  int32_t iVar42;
  int iVar43;
  int iVar44;
  int iVar45;
  int iVar46;
  int iVar47;
  int iVar48;
  int iVar49;
  int iVar50;
  __m128i vH;
  __m128i vH_00;
  int32_t in_stack_fffffffffffffe98;
  __m128i *local_150;
  __m128i_32_t e;
  __m128i_32_t h;
  
  if (profile == (parasail_profile_t *)0x0) {
    __format = "%s: missing %s\n";
    pcVar11 = "profile";
  }
  else {
    pvVar4 = (profile->profile32).score;
    if (pvVar4 == (void *)0x0) {
      __format = "%s: missing %s\n";
      pcVar11 = "profile->profile32.score";
    }
    else {
      ppVar5 = profile->matrix;
      if (ppVar5 == (parasail_matrix_t *)0x0) {
        __format = "%s: missing %s\n";
        pcVar11 = "profile->matrix";
      }
      else {
        uVar33 = profile->s1Len;
        if ((int)uVar33 < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar11 = "profile->s1Len";
        }
        else if (s2 == (char *)0x0) {
          __format = "%s: missing %s\n";
          pcVar11 = "s2";
        }
        else if (s2Len < 1) {
          __format = "%s: %s must be > 0\n";
          pcVar11 = "s2Len";
        }
        else if (open < 0) {
          __format = "%s: %s must be >= 0\n";
          pcVar11 = "open";
        }
        else {
          if (-1 < gap) {
            uVar20 = uVar33 - 1;
            size = (ulong)uVar33 + 3 >> 2;
            iVar12 = -open;
            iVar15 = ppVar5->min;
            uVar10 = 0x80000000 - iVar15;
            if (iVar15 != iVar12 && SBORROW4(iVar15,iVar12) == iVar15 + open < 0) {
              uVar10 = open | 0x80000000;
            }
            uVar6 = 0x7ffffffe - ppVar5->max;
            ppVar8 = parasail_result_new_table1((uint)((ulong)uVar33 + 3) & 0x7ffffffc,s2Len);
            if (ppVar8 != (parasail_result_t *)0x0) {
              ppVar8->flag = ppVar8->flag | 0x4420801;
              palVar9 = parasail_memalign___m128i(0x10,size);
              local_150 = parasail_memalign___m128i(0x10,size);
              ptr = parasail_memalign___m128i(0x10,size);
              ptr_00 = parasail_memalign_int32_t(0x10,(ulong)(s2Len + 1));
              if ((ptr_00 != (int32_t *)0x0 && ptr != (__m128i *)0x0) &&
                  (local_150 != (__m128i *)0x0 && palVar9 != (__m128i *)0x0)) {
                iVar7 = s2Len + -1;
                uVar10 = uVar10 + 1;
                iVar14 = (int)size;
                palVar17 = palVar9;
                iVar15 = iVar12;
                for (uVar21 = 0; uVar21 != size; uVar21 = uVar21 + 1) {
                  iVar19 = iVar15;
                  for (lVar16 = 0; lVar16 != 4; lVar16 = lVar16 + 1) {
                    lVar18 = (long)iVar19 - (ulong)(uint)open;
                    if (lVar18 < -0x7fffffff) {
                      lVar18 = -0x80000000;
                    }
                    *(int *)((long)&h + lVar16 * 4) = iVar19;
                    *(int *)((long)&e + lVar16 * 4) = (int)lVar18;
                    iVar19 = iVar19 - gap * iVar14;
                  }
                  palVar17 = (__m128i *)(uVar21 * 0x10);
                  palVar9[uVar21][0] = h.m[0];
                  palVar9[uVar21][1] = h.m[1];
                  ptr[uVar21][0] = e.m[0];
                  ptr[uVar21][1] = e.m[1];
                  iVar15 = iVar15 - gap;
                }
                *ptr_00 = 0;
                for (uVar21 = 1; s2Len + 1 != uVar21; uVar21 = uVar21 + 1) {
                  ptr_00[uVar21] = iVar12;
                  iVar12 = iVar12 - gap;
                }
                uVar21 = 0;
                uVar33 = uVar10;
                uVar35 = uVar10;
                uVar36 = uVar10;
                uVar37 = uVar10;
                uVar38 = uVar6;
                uVar39 = uVar6;
                uVar40 = uVar6;
                uVar41 = uVar6;
                do {
                  ptr_01 = palVar9;
                  if (uVar21 == (uint)s2Len) {
                    alVar24 = ptr_01[(ulong)uVar20 % size];
                    iVar15 = 0;
                    while( true ) {
                      uVar21 = alVar24[0];
                      lVar16 = alVar24[1];
                      if (3 - (int)(uVar20 / size) <= iVar15) break;
                      alVar24[0] = uVar21 << 0x20;
                      alVar24[1] = lVar16 << 0x20 | uVar21 >> 0x20;
                      iVar15 = iVar15 + 1;
                    }
                    auVar29._0_4_ = -(uint)((int)uVar38 < (int)uVar10);
                    auVar29._4_4_ = -(uint)((int)uVar39 < (int)uVar10);
                    auVar29._8_4_ = -(uint)((int)uVar40 < (int)uVar10);
                    auVar29._12_4_ = -(uint)((int)uVar41 < (int)uVar10);
                    auVar34._0_4_ = -(uint)((int)uVar6 < (int)uVar33);
                    auVar34._4_4_ = -(uint)((int)uVar6 < (int)uVar35);
                    auVar34._8_4_ = -(uint)((int)uVar6 < (int)uVar36);
                    auVar34._12_4_ = -(uint)((int)uVar6 < (int)uVar37);
                    iVar15 = movmskps(iVar15,auVar34 | auVar29);
                    if (iVar15 == 0) {
                      iVar15 = alVar24[1]._4_4_;
                    }
                    else {
                      *(byte *)&ppVar8->flag = (byte)ppVar8->flag | 0x40;
                      iVar15 = 0;
                      iVar7 = 0;
                      uVar20 = 0;
                    }
                    ppVar8->score = iVar15;
                    ppVar8->end_query = uVar20;
                    ppVar8->end_ref = iVar7;
                    parasail_free(ptr_00);
                    parasail_free(ptr);
                    parasail_free(local_150);
                    parasail_free(ptr_01);
                    return ppVar8;
                  }
                  iVar3 = ppVar5->mapper[(byte)s2[uVar21]];
                  palVar9 = ptr_01 + (iVar14 - 1);
                  iVar15 = (int)(*palVar9)[0];
                  iVar12 = *(int *)((long)*palVar9 + 4);
                  iVar19 = (int)(*palVar9)[1];
                  iVar42 = ptr_00[uVar21];
                  lVar16 = 0;
                  uVar28 = uVar10;
                  uVar30 = uVar10;
                  uVar31 = uVar10;
                  uVar32 = uVar10;
                  for (uVar13 = 0; size != uVar13; uVar13 = uVar13 + 1) {
                    piVar2 = (int *)((long)pvVar4 + lVar16 + (long)(iVar3 * iVar14) * 0x10);
                    iVar43 = iVar42 + *piVar2;
                    iVar15 = iVar15 + piVar2[1];
                    iVar12 = iVar12 + piVar2[2];
                    iVar19 = iVar19 + piVar2[3];
                    piVar2 = (int *)((long)*ptr + lVar16);
                    iVar44 = *piVar2;
                    iVar45 = piVar2[1];
                    iVar46 = piVar2[2];
                    iVar47 = piVar2[3];
                    uVar22 = (iVar44 < (int)uVar28) * uVar28 |
                             (uint)(iVar44 >= (int)uVar28) * iVar44;
                    uVar25 = (iVar45 < (int)uVar30) * uVar30 |
                             (uint)(iVar45 >= (int)uVar30) * iVar45;
                    uVar26 = (iVar46 < (int)uVar31) * uVar31 |
                             (uint)(iVar46 >= (int)uVar31) * iVar46;
                    uVar27 = (iVar47 < (int)uVar32) * uVar32 |
                             (uint)(iVar47 >= (int)uVar32) * iVar47;
                    uVar22 = (uint)((int)uVar22 < iVar43) * iVar43 |
                             ((int)uVar22 >= iVar43) * uVar22;
                    uVar25 = (uint)((int)uVar25 < iVar15) * iVar15 |
                             ((int)uVar25 >= iVar15) * uVar25;
                    uVar26 = (uint)((int)uVar26 < iVar12) * iVar12 |
                             ((int)uVar26 >= iVar12) * uVar26;
                    uVar27 = (uint)((int)uVar27 < iVar19) * iVar19 |
                             ((int)uVar27 >= iVar19) * uVar27;
                    puVar1 = (uint *)((long)*local_150 + lVar16);
                    *puVar1 = uVar22;
                    puVar1[1] = uVar25;
                    puVar1[2] = uVar26;
                    puVar1[3] = uVar27;
                    uVar33 = ((int)uVar33 < (int)uVar22) * uVar22 |
                             ((int)uVar33 >= (int)uVar22) * uVar33;
                    uVar35 = ((int)uVar35 < (int)uVar25) * uVar25 |
                             ((int)uVar35 >= (int)uVar25) * uVar35;
                    uVar36 = ((int)uVar36 < (int)uVar26) * uVar26 |
                             ((int)uVar36 >= (int)uVar26) * uVar36;
                    uVar37 = ((int)uVar37 < (int)uVar27) * uVar27 |
                             ((int)uVar37 >= (int)uVar27) * uVar37;
                    uVar38 = (uint)(iVar44 < (int)uVar38) * iVar44 |
                             (iVar44 >= (int)uVar38) * uVar38;
                    uVar39 = (uint)(iVar45 < (int)uVar39) * iVar45 |
                             (iVar45 >= (int)uVar39) * uVar39;
                    uVar40 = (uint)(iVar46 < (int)uVar40) * iVar46 |
                             (iVar46 >= (int)uVar40) * uVar40;
                    uVar41 = (uint)(iVar47 < (int)uVar41) * iVar47 |
                             (iVar47 >= (int)uVar41) * uVar41;
                    uVar38 = ((int)uVar28 < (int)uVar38) * uVar28 |
                             ((int)uVar28 >= (int)uVar38) * uVar38;
                    uVar39 = ((int)uVar30 < (int)uVar39) * uVar30 |
                             ((int)uVar30 >= (int)uVar39) * uVar39;
                    uVar40 = ((int)uVar31 < (int)uVar40) * uVar31 |
                             ((int)uVar31 >= (int)uVar40) * uVar40;
                    uVar41 = ((int)uVar32 < (int)uVar41) * uVar32 |
                             ((int)uVar32 >= (int)uVar41) * uVar41;
                    uVar38 = ((int)uVar22 < (int)uVar38) * uVar22 |
                             ((int)uVar22 >= (int)uVar38) * uVar38;
                    uVar39 = ((int)uVar25 < (int)uVar39) * uVar25 |
                             ((int)uVar25 >= (int)uVar39) * uVar39;
                    uVar40 = ((int)uVar26 < (int)uVar40) * uVar26 |
                             ((int)uVar26 >= (int)uVar40) * uVar40;
                    uVar41 = ((int)uVar27 < (int)uVar41) * uVar27 |
                             ((int)uVar27 >= (int)uVar41) * uVar41;
                    vH[0] = uVar13 & 0xffffffff;
                    vH[1] = size;
                    arr_store_si128(((ppVar8->field_4).rowcols)->score_row,vH,(int32_t)uVar21,s2Len,
                                    (int32_t)palVar17,in_stack_fffffffffffffe98);
                    iVar43 = uVar22 - open;
                    iVar48 = uVar25 - open;
                    iVar49 = uVar26 - open;
                    iVar50 = uVar27 - open;
                    iVar44 = iVar44 - gap;
                    iVar45 = iVar45 - gap;
                    iVar46 = iVar46 - gap;
                    iVar47 = iVar47 - gap;
                    puVar1 = (uint *)((long)*ptr + lVar16);
                    *puVar1 = (uint)(iVar44 < iVar43) * iVar43 | (uint)(iVar44 >= iVar43) * iVar44;
                    puVar1[1] = (uint)(iVar45 < iVar48) * iVar48 | (uint)(iVar45 >= iVar48) * iVar45
                    ;
                    puVar1[2] = (uint)(iVar46 < iVar49) * iVar49 | (uint)(iVar46 >= iVar49) * iVar46
                    ;
                    puVar1[3] = (uint)(iVar47 < iVar50) * iVar50 | (uint)(iVar47 >= iVar50) * iVar47
                    ;
                    iVar15 = uVar28 - gap;
                    iVar12 = uVar30 - gap;
                    iVar19 = uVar31 - gap;
                    iVar44 = uVar32 - gap;
                    uVar28 = (uint)(iVar15 < iVar43) * iVar43 | (uint)(iVar15 >= iVar43) * iVar15;
                    uVar30 = (uint)(iVar12 < iVar48) * iVar48 | (uint)(iVar12 >= iVar48) * iVar12;
                    uVar31 = (uint)(iVar19 < iVar49) * iVar49 | (uint)(iVar19 >= iVar49) * iVar19;
                    uVar32 = (uint)(iVar44 < iVar50) * iVar50 | (uint)(iVar44 >= iVar50) * iVar44;
                    piVar2 = (int *)((long)*ptr_01 + lVar16);
                    iVar42 = *piVar2;
                    iVar15 = piVar2[1];
                    iVar12 = piVar2[2];
                    iVar19 = piVar2[3];
                    lVar16 = lVar16 + 0x10;
                  }
                  for (iVar15 = 0; iVar15 != 4; iVar15 = iVar15 + 1) {
                    uVar13 = 0;
                    palVar9 = local_150;
                    uVar32 = ptr_00[uVar21 + 1] - open;
                    uVar22 = uVar31;
                    while (uVar31 = uVar30, uVar30 = uVar28, uVar28 = uVar32, size != uVar13) {
                      iVar12 = (int)(*palVar9)[0];
                      iVar19 = *(int *)((long)*palVar9 + 4);
                      iVar3 = (int)(*palVar9)[1];
                      iVar44 = *(int *)((long)*palVar9 + 0xc);
                      uVar32 = (iVar12 < (int)uVar28) * uVar28 |
                               (uint)(iVar12 >= (int)uVar28) * iVar12;
                      uVar25 = (iVar19 < (int)uVar30) * uVar30 |
                               (uint)(iVar19 >= (int)uVar30) * iVar19;
                      uVar26 = (iVar3 < (int)uVar31) * uVar31 | (uint)(iVar3 >= (int)uVar31) * iVar3
                      ;
                      uVar27 = (iVar44 < (int)uVar22) * uVar22 |
                               (uint)(iVar44 >= (int)uVar22) * iVar44;
                      *(uint *)*palVar9 = uVar32;
                      *(uint *)((long)*palVar9 + 4) = uVar25;
                      *(uint *)(*palVar9 + 1) = uVar26;
                      *(uint *)((long)*palVar9 + 0xc) = uVar27;
                      uVar38 = ((int)uVar32 < (int)uVar38) * uVar32 |
                               ((int)uVar32 >= (int)uVar38) * uVar38;
                      uVar39 = ((int)uVar25 < (int)uVar39) * uVar25 |
                               ((int)uVar25 >= (int)uVar39) * uVar39;
                      uVar40 = ((int)uVar26 < (int)uVar40) * uVar26 |
                               ((int)uVar26 >= (int)uVar40) * uVar40;
                      uVar41 = ((int)uVar27 < (int)uVar41) * uVar27 |
                               ((int)uVar27 >= (int)uVar41) * uVar41;
                      uVar33 = ((int)uVar33 < (int)uVar32) * uVar32 |
                               ((int)uVar33 >= (int)uVar32) * uVar33;
                      uVar35 = ((int)uVar35 < (int)uVar25) * uVar25 |
                               ((int)uVar35 >= (int)uVar25) * uVar35;
                      uVar36 = ((int)uVar36 < (int)uVar26) * uVar26 |
                               ((int)uVar36 >= (int)uVar26) * uVar36;
                      uVar37 = ((int)uVar37 < (int)uVar27) * uVar27 |
                               ((int)uVar37 >= (int)uVar27) * uVar37;
                      vH_00[0] = uVar13 & 0xffffffff;
                      vH_00[1] = size;
                      arr_store_si128(((ppVar8->field_4).rowcols)->score_row,vH_00,(int32_t)uVar21,
                                      s2Len,(int32_t)palVar17,in_stack_fffffffffffffe98);
                      uVar22 = uVar22 - gap;
                      auVar23._0_4_ = -(uint)((int)(uVar32 - open) < (int)(uVar28 - gap));
                      auVar23._4_4_ = -(uint)((int)(uVar25 - open) < (int)(uVar30 - gap));
                      auVar23._8_4_ = -(uint)((int)(uVar26 - open) < (int)(uVar31 - gap));
                      auVar23._12_4_ = -(uint)((int)(uVar27 - open) < (int)uVar22);
                      iVar12 = movmskps(extraout_EAX,auVar23);
                      uVar13 = uVar13 + 1;
                      palVar9 = palVar9 + 1;
                      uVar32 = uVar28 - gap;
                      uVar28 = uVar30 - gap;
                      uVar30 = uVar31 - gap;
                      if (iVar12 == 0) goto LAB_00668428;
                    }
                  }
LAB_00668428:
                  uVar21 = uVar21 + 1;
                  palVar9 = local_150;
                  local_150 = ptr_01;
                } while( true );
              }
            }
            return (parasail_result_t *)0x0;
          }
          __format = "%s: %s must be >= 0\n";
          pcVar11 = "gap";
        }
      }
    }
  }
  fprintf(_stderr,__format,"parasail_nw_table_striped_profile_sse41_128_32",pcVar11);
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvE = NULL;
    int32_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    int32_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile32.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile = (__m128i*)profile->profile32.score;
    vGapO = _mm_set1_epi32(open);
    vGapE = _mm_set1_epi32(gap);
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_NW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_4;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m128i(16, segLen);
    pvHLoad  = parasail_memalign___m128i(16, segLen);
    pvE      = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int32_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!boundary) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_32_t h;
            __m128i_32_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = -open-gap*(segNum*segLen+i);
                h.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
            }
            _mm_store_si128(&pvHStore[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = -open-gap*(i-1);
            boundary[i] = tmp < INT32_MIN ? INT32_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        /* Initialize F value to -inf.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        __m128i vF = vNegLimit;

        /* load final segment of pvHStore and shift left by 2 bytes */
        __m128i vH = _mm_slli_si128(pvHStore[segLen - 1], 4);

        /* Correct part of the vProfile */
        const __m128i* vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        __m128i* pv = pvHLoad;
        pvHLoad = pvHStore;
        pvHStore = pv;

        /* insert upper boundary condition */
        vH = _mm_insert_epi32(vH, boundary[j], 0);

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm_add_epi32(vH, _mm_load_si128(vP + i));
            vE = _mm_load_si128(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm_max_epi32(vH, vE);
            vH = _mm_max_epi32(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);
            vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vH);
            vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vE);
            vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vF);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif

            /* Update vE value. */
            vH = _mm_sub_epi32(vH, vGapO);
            vE = _mm_sub_epi32(vE, vGapE);
            vE = _mm_max_epi32(vE, vH);
            _mm_store_si128(pvE + i, vE);

            /* Update vF value. */
            vF = _mm_sub_epi32(vF, vGapE);
            vF = _mm_max_epi32(vF, vH);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            int64_t tmp = boundary[j+1]-open;
            int32_t tmp2 = tmp < INT32_MIN ? INT32_MIN : tmp;
            vF = _mm_slli_si128(vF, 4);
            vF = _mm_insert_epi32(vF, tmp2, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi32(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vH = _mm_sub_epi32(vH, vGapO);
                vF = _mm_sub_epi32(vF, vGapE);
                if (! _mm_movemask_epi8(_mm_cmpgt_epi32(vF, vH))) goto end;
                /*vF = _mm_max_epi32(vF, vH);*/
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 4);
            }
            result->rowcols->score_row[j] = (int32_t) _mm_extract_epi32 (vH, 3);
        }
#endif
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* extract last value from the last column */
    {
        __m128i vH = _mm_load_si128(pvHStore + offset);
        for (k=0; k<position; ++k) {
            vH = _mm_slli_si128 (vH, 4);
        }
        score = (int32_t) _mm_extract_epi32 (vH, 3);
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi32(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(boundary);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}